

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_network.cpp
# Opt level: O1

size_t sensors_analytics::helpers::HeaderCallback
                 (void *data,size_t size,size_t nmemb,void *user_data)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  mapped_type *pmVar5;
  ulong uVar6;
  string header;
  string value;
  string key;
  key_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  ulong local_78;
  char local_70 [16];
  char *local_60;
  key_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  undefined1 *local_30;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,data,(void *)((long)data + size * nmemb));
  lVar3 = std::__cxx11::string::find((char)&local_a0,0x3a);
  if (lVar3 == -1) {
    local_58._M_dataplus._M_p = local_a0._M_dataplus._M_p + local_a0._M_string_length;
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a0._M_dataplus._M_p;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<sensors_analytics::helpers::TrimRight(std::__cxx11::string&)::_lambda(int)_1_>>
              (&local_60);
    _Var1._M_p = local_a0._M_dataplus._M_p;
    local_a0._M_string_length = (long)local_60 - (long)local_a0._M_dataplus._M_p;
    *local_60 = '\0';
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<sensors_analytics::helpers::TrimLeft(std::__cxx11::string&)::_lambda(int)_1_>>
                      (local_a0._M_dataplus._M_p,
                       local_a0._M_dataplus._M_p + local_a0._M_string_length);
    uVar6 = (long)_Var1._M_p - (long)local_a0._M_dataplus._M_p;
    if (local_a0._M_dataplus._M_p + local_a0._M_string_length == _Var4._M_current) {
      local_a0._M_dataplus._M_p[uVar6] = '\0';
      local_a0._M_string_length = uVar6;
    }
    else {
      std::__cxx11::string::_M_erase((ulong)&local_a0,uVar6);
    }
    if (local_a0._M_string_length != 0) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)user_data + 0x28),&local_a0);
      std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x11d919);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_a0);
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_58._M_dataplus._M_p + local_58._M_string_length);
    local_60 = local_58._M_dataplus._M_p;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<sensors_analytics::helpers::TrimRight(std::__cxx11::string&)::_lambda(int)_1_>>
              (&local_38);
    _Var1._M_p = local_58._M_dataplus._M_p;
    local_58._M_string_length = (long)local_38 - (long)local_58._M_dataplus._M_p;
    local_38->_M_local_buf[0] = '\0';
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<sensors_analytics::helpers::TrimLeft(std::__cxx11::string&)::_lambda(int)_1_>>
                      (local_58._M_dataplus._M_p,
                       local_58._M_dataplus._M_p + local_58._M_string_length);
    uVar6 = (long)_Var1._M_p - (long)local_58._M_dataplus._M_p;
    if (local_58._M_dataplus._M_p + local_58._M_string_length == _Var4._M_current) {
      local_58._M_dataplus._M_p[uVar6] = '\0';
      local_58._M_string_length = uVar6;
    }
    else {
      std::__cxx11::string::_M_erase((ulong)&local_58,uVar6);
    }
    std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_a0);
    local_60 = local_80->_M_local_buf + local_78;
    local_38 = local_80;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<sensors_analytics::helpers::TrimRight(std::__cxx11::string&)::_lambda(int)_1_>>
              (&local_30);
    paVar2 = local_80;
    local_78 = (long)local_30 - (long)local_80;
    *local_30 = 0;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<sensors_analytics::helpers::TrimLeft(std::__cxx11::string&)::_lambda(int)_1_>>
                      (local_80,local_80->_M_local_buf + local_78);
    uVar6 = (long)paVar2 - (long)local_80;
    if (local_80->_M_local_buf + local_78 == _Var4._M_current) {
      local_80->_M_local_buf[uVar6] = '\0';
      local_78 = uVar6;
    }
    else {
      std::__cxx11::string::_M_erase((ulong)&local_80,uVar6);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)user_data + 0x28),&local_58);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if (local_80 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return size * nmemb;
}

Assistant:

size_t helpers::HeaderCallback(void *data, size_t size, size_t nmemb,
                               void *user_data) {
  Response *r;
  r = reinterpret_cast<Response *>(user_data);
  string header(reinterpret_cast<char *>(data), size * nmemb);
  size_t separator = header.find_first_of(':');
  if (string::npos == separator) {
    // roll with non seperated headers...
    Trim(header);
    if (0 == header.length()) {
      return (size * nmemb);  // blank line;
    }
    r->headers_[header] = "present";
  } else {
    string key = header.substr(0, separator);
    Trim(key);
    string value = header.substr(separator + 1);
    Trim(value);
    r->headers_[key] = value;
  }

  return (size * nmemb);
}